

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O0

bool __thiscall ithipublisher::PublishDataM5(ithipublisher *this,FILE *F)

{
  int iVar1;
  bool bVar2;
  undefined1 local_160 [8];
  vector<double,_std::allocator<double>_> mvec;
  size_t i;
  size_t nbSubMet;
  char *subMet [34];
  bool local_19;
  bool ret;
  FILE *F_local;
  ithipublisher *this_local;
  
  memcpy(&nbSubMet,&PTR_anon_var_dwarf_6cd25_0025a710,0x110);
  iVar1 = fprintf((FILE *)F,"\"M5\" : [");
  bVar2 = 0 < iVar1;
  for (mvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      mvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage < (pointer)0x22;
      mvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)mvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_160);
    local_19 = GetVector(this,subMet[(long)mvec.super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage + -1],
                         (char *)0x0,(vector<double,_std::allocator<double>_> *)local_160);
    if (mvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      iVar1 = fprintf((FILE *)F,",\n");
      local_19 = local_19 && 0 < iVar1;
    }
    iVar1 = fprintf((FILE *)F,"{ \"v\" : ");
    local_19 = (local_19 & 0 < iVar1) != 0;
    if (local_19) {
      local_19 = PrintVector(this,F,(vector<double,_std::allocator<double>_> *)local_160,1.0);
    }
    iVar1 = fprintf((FILE *)F,"}");
    bVar2 = (local_19 & 0 < iVar1) != 0;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_160);
  }
  iVar1 = fprintf((FILE *)F,"]\n");
  return (bool)(bVar2 & 0 < iVar1);
}

Assistant:

bool ithipublisher::PublishDataM5(FILE * F)
{
    bool ret = true;
    const char * subMet[] = { "M5.1.1", "M5.1.2", "M5.1.3", "M5.1.4", "M5.1.5", "M5.1.6",
        "M5.2.1", "M5.2.2", "M5.2.3", "M5.3.1", "M5.3.2", "M5.4.1", "M5.4.2", "M5.5",
        "M5.6.1", "M5.6.2", "M5.6.3", "M5.6.4", "M5.6.5", "M5.6.6", "M5.6.7", "M5.6.8",
        "M5.6.9", "M5.6.10", "M5.6.11", "M5.6.12", "M5.6.13", "M5.6.14", "M5.6.15", "M5.6.16",
        "M5.7.1", "M5.7.2", "M5.7.9", "M5.7.10"
    };
    const size_t nbSubMet = sizeof(subMet) / sizeof(const char *);

    ret &= fprintf(F, "\"M5\" : [") > 0;

    for (size_t i=0; i<nbSubMet; i++) {
        std::vector<double> mvec;

        ret = GetVector(subMet[i], NULL, &mvec);

        if (i != 0) {
            ret &= fprintf(F, ",\n") > 0;
        }

        ret &= fprintf(F, "{ \"v\" : ") > 0;

        if (ret)
        {
            ret = PrintVector(F, &mvec, 1.0);
        }

        ret &= fprintf(F, "}") > 0;
    }
    ret &= fprintf(F, "]\n") > 0;

    return ret;
}